

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  void *pvVar1;
  Command *this;
  
  pvVar1 = operator_new(1);
  this = (Command *)operator_new(0x20);
  Command::Command(this);
  *(undefined ***)this = &PTR__Command_00103d60;
  *(code **)(this + 8) = MyClass::Action;
  *(undefined8 *)(this + 0x10) = 0;
  *(void **)(this + 0x18) = pvVar1;
  MyClass::Action();
  return 0;
}

Assistant:

int main()
{
    MyClass* receiver = new MyClass;

    // ...

    Command* aCommand =
        new SimpleCommand<MyClass>(receiver, &MyClass::Action);

    // ...

    aCommand->Execute();
}